

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O0

void __thiscall wirehair::Codec::InitializeColumnValues(Codec *this)

{
  ushort uVar1;
  uint *in_RDI;
  uint16_t ge_row_i_1;
  uint8_t *src;
  PeelColumn *column;
  uint16_t column_i;
  PeelRowIterator iter;
  PeelRow *row;
  uint8_t *combo;
  uint16_t row_i;
  uint8_t *buffer_dest;
  uint16_t ge_row_i;
  uint16_t dest_column_i;
  uint16_t pivot_i;
  uint16_t column_count;
  uint16_t first_heavy_row;
  void *in_stack_00000078;
  void *in_stack_00000080;
  void *in_stack_00000088;
  uint16_t distanceToP;
  int in_stack_0000015c;
  void *in_stack_00000160;
  void *in_stack_00000168;
  short local_82;
  ushort local_80;
  ushort local_7e;
  ushort local_7c;
  ushort local_7a;
  long local_78;
  void *local_70;
  ushort local_62;
  void *local_60;
  ushort local_52;
  ushort local_50;
  ushort local_4e;
  ushort local_4c;
  ushort local_4a;
  ushort local_3c;
  ushort local_3a;
  short *local_38;
  short *local_30;
  short *local_28;
  short *local_20;
  char local_11;
  ushort local_10;
  ushort local_e;
  ushort local_c;
  ushort local_a;
  ushort *local_8;
  
  local_4a = *(short *)((long)in_RDI + 0x8e) + *(short *)((long)in_RDI + 10);
  local_4c = *(short *)((long)in_RDI + 0x8e) + (short)in_RDI[6];
  for (local_4e = 0; local_4e < local_4c; local_4e = local_4e + 1) {
    local_50 = *(ushort *)(*(long *)(in_RDI + 0x32) + (ulong)local_4e * 2);
    local_52 = *(ushort *)(*(long *)(in_RDI + 0x2e) + (ulong)local_4e * 2);
    local_60 = (void *)(*(long *)(in_RDI + 8) + (ulong)(*in_RDI * (uint)local_50));
    if ((local_52 < *(ushort *)((long)in_RDI + 10)) ||
       ((uint)local_4a + (uint)(ushort)in_RDI[5] <= (uint)local_52)) {
      memset(local_60,0,(ulong)*in_RDI);
      *(ushort *)(*(long *)(in_RDI + 0x34) + (ulong)local_52 * 2) = local_50;
    }
    else {
      local_62 = *(ushort *)(*(long *)(in_RDI + 0x34) + (ulong)local_52 * 2);
      local_70 = (void *)(*(long *)(in_RDI + 0xc) + (ulong)(*in_RDI * (uint)local_62));
      local_78 = *(long *)(in_RDI + 0x18) + (ulong)local_62 * 0x18;
      if ((uint)local_62 == (ushort)in_RDI[1] - 1) {
        memcpy(local_60,local_70,(ulong)in_RDI[0xe]);
        memset((void *)((long)local_60 + (ulong)in_RDI[0xe]),0,(ulong)(*in_RDI - in_RDI[0xe]));
        local_70 = (void *)0x0;
      }
      local_38 = (short *)(local_78 + 6);
      local_3a = (ushort)in_RDI[1];
      local_3c = *(ushort *)((long)in_RDI + 6);
      local_30 = &local_82;
      local_80 = *(ushort *)(local_78 + 8);
      local_82 = *local_38 + -1;
      local_7e = *(ushort *)(local_78 + 10);
      local_7c = local_3a;
      local_7a = local_3c;
      do {
        local_28 = &local_82;
        if (*(char *)(*(long *)(in_RDI + 0x1a) + (ulong)local_80 * 6 + 4) == '\x01') {
          if (local_70 == (void *)0x0) {
            gf256_add_mem(in_stack_00000168,in_stack_00000160,in_stack_0000015c);
          }
          else {
            gf256_addset_mem(in_stack_00000088,in_stack_00000080,in_stack_00000078,this._4_4_);
            local_70 = (void *)0x0;
          }
        }
        local_20 = &local_82;
        if (local_82 == 0) {
          local_11 = '\0';
        }
        else {
          local_82 = local_82 + -1;
          local_8 = &local_80;
          local_a = local_7c;
          local_c = local_7a;
          local_e = local_7e;
          uVar1 = (ushort)((ulong)((uint)local_80 + (uint)local_7e) %
                          (ulong)(long)(int)(uint)local_7a);
          if (local_7c <= local_80) {
            local_10 = local_7a - local_80;
            if (local_7e < local_10) {
              uVar1 = (ushort)(((uint)local_7e * 0x10000 - (uint)local_10) % (uint)local_7e);
            }
            else {
              uVar1 = local_7e - local_10;
            }
          }
          local_80 = uVar1;
          local_11 = '\x01';
        }
      } while (local_11 != '\0');
      if (local_70 != (void *)0x0) {
        memcpy(local_60,local_70,(ulong)*in_RDI);
      }
    }
  }
  for (; (uint)local_4e < in_RDI[0x30]; local_4e = local_4e + 1) {
    uVar1 = *(ushort *)(*(long *)(in_RDI + 0x2e) + (ulong)local_4e * 2);
    if ((uVar1 < *(ushort *)((long)in_RDI + 10)) || ((local_4a <= uVar1 && (uVar1 < local_4c)))) {
      *(undefined2 *)(*(long *)(in_RDI + 0x34) + (ulong)uVar1 * 2) = 0xffff;
    }
  }
  return;
}

Assistant:

void Codec::InitializeColumnValues()
{
    CAT_IF_DUMP(cout << endl << "---- InitializeColumnValues ----" << endl << endl;)

    CAT_IF_ROWOP(uint32_t rowops = 0;)

    const uint16_t first_heavy_row = _defer_count + _dense_count;
    const uint16_t column_count = _defer_count + _mix_count;

    uint16_t pivot_i;

    // For each pivot:
    for (pivot_i = 0; pivot_i < column_count; ++pivot_i)
    {
        // Lookup pivot column, GE row, and destination buffer
        const uint16_t dest_column_i = _ge_col_map[pivot_i];
        const uint16_t ge_row_i = _pivots[pivot_i];
        CAT_DEBUG_ASSERT(dest_column_i < _recovery_rows);
        uint8_t * GF256_RESTRICT buffer_dest = _recovery_blocks + _block_bytes * dest_column_i;

        CAT_IF_DUMP(cout << "Pivot " << pivot_i << " solving column " << dest_column_i << " with GE row " << ge_row_i << " : ";)

        // If it is a dense/heavy(non-extra) row,
        if (ge_row_i < _dense_count ||
            ge_row_i >= (first_heavy_row + _extra_count))
        {
            // Dense/heavy rows sum to zero
            memset(buffer_dest, 0, _block_bytes);

            // Store which column solves the dense row
            _ge_row_map[ge_row_i] = dest_column_i;

            CAT_IF_DUMP(cout << "[0]" << endl;)
            CAT_IF_ROWOP(++rowops;)

            continue;
        }

        // Look up row and input value for GE row
        const uint16_t row_i = _ge_row_map[ge_row_i];
        const uint8_t * GF256_RESTRICT combo = _input_blocks + _block_bytes * row_i;
        PeelRow * GF256_RESTRICT row = &_peel_rows[row_i];

        CAT_IF_DUMP(cout << "[" << (unsigned)combo[0] << "]";)

        // If copying from final input block:
        if (row_i == _block_count - 1)
        {
            memcpy(buffer_dest, combo, _input_final_bytes);
            memset(buffer_dest + _input_final_bytes, 0, _block_bytes - _input_final_bytes);

            CAT_IF_ROWOP(++rowops;)

            combo = 0;
        }

        PeelRowIterator iter(row->Params, _block_count, _block_next_prime);

        // Eliminate peeled columns:
        do
        {
            const uint16_t column_i = iter.GetColumn();

            PeelColumn * GF256_RESTRICT column = &_peel_cols[column_i];

            // If column is peeled:
            if (column->Mark == MARK_PEEL)
            {
                CAT_DEBUG_ASSERT(column_i < _recovery_rows);
                const uint8_t * GF256_RESTRICT src = _recovery_blocks + _block_bytes * column_i;

                // If combo unused:
                if (!combo) {
                    gf256_add_mem(buffer_dest, src, _block_bytes);
                }
                else
                {
                    // Use combo
                    gf256_addset_mem(buffer_dest, combo, src, _block_bytes);

                    combo = 0;
                }
                CAT_IF_ROWOP(++rowops;)
            }
        } while (iter.Iterate());

        // If combo still unused:
        if (combo) {
            memcpy(buffer_dest, combo, _block_bytes);
        }

        CAT_IF_DUMP(cout << endl;)
    }

    // For each remaining pivot:
    for (; pivot_i < _pivot_count; ++pivot_i)
    {
        const uint16_t ge_row_i = _pivots[pivot_i];

        // If row is a dense row,
        if (ge_row_i < _dense_count ||
            (ge_row_i >= first_heavy_row && ge_row_i < column_count))
        {
            // Mark it for skipping
            _ge_row_map[ge_row_i] = LIST_TERM;

            CAT_IF_DUMP(cout << "Did not use GE row " << ge_row_i << ", which is a dense row." << endl;)
        }
        else {
            CAT_IF_DUMP(cout << "Did not use deferred row " << ge_row_i << ", which is not a dense row." << endl;)
        }
    }

    CAT_IF_ROWOP(cout << "InitializeColumnValues used " << rowops << " row ops = " << rowops / (double)_block_count << "*N" << endl;)
}